

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXExportProperty::DumpAscii(FBXExportProperty *this,ostream *s,int indent)

{
  pointer puVar1;
  char cVar2;
  double *pdVar3;
  size_t i_1;
  ulong uVar4;
  pointer puVar5;
  ostream *poVar6;
  runtime_error *prVar7;
  pointer puVar8;
  long lVar9;
  int i;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  size_t i_3;
  char cStack_1d0;
  string asStack_1c8 [32];
  ostringstream err;
  
  pdVar3 = (double *)
           (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = (long)(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pdVar3;
  cVar2 = this->type;
  uVar11 = uVar12;
  switch(cVar2) {
  case 'C':
    if (*(char *)pdVar3 == '\0') {
      cStack_1d0 = 'F';
    }
    else {
      cStack_1d0 = 'T';
    }
    break;
  case 'D':
    std::ostream::_M_insert<double>(*pdVar3);
    return;
  case 'E':
  case 'G':
  case 'H':
  case 'J':
  case 'K':
  case 'M':
  case 'N':
  case 'O':
  case 'P':
  case 'Q':
    goto switchD_005a22a1_caseD_45;
  case 'F':
    std::ostream::operator<<(s,*(float *)pdVar3);
    return;
  case 'I':
    std::ostream::operator<<(s,(int)*(float *)pdVar3);
    return;
  case 'L':
    std::ostream::_M_insert<long>((long)s);
    return;
  case 'S':
    for (uVar4 = 0;
        (uVar11 = uVar12, uVar12 != uVar4 &&
        (uVar11 = uVar4, *(char *)((long)pdVar3 + uVar4) != '\0')); uVar4 = uVar4 + 1) {
    }
  case 'R':
    std::operator<<(s,'\"');
    puVar5 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar8 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar9 = 0;
    while ((long)puVar8 - (long)puVar5 != lVar9) {
      puVar1 = puVar5 + lVar9;
      lVar9 = lVar9 + 1;
      if (*puVar1 == '\"') {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"can\'t handle quotes in property string");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    for (uVar12 = uVar11 + 2; uVar12 < (ulong)((long)puVar8 - (long)puVar5); uVar12 = uVar12 + 1) {
      std::operator<<(s,puVar5[uVar12]);
      puVar5 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar8 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    if (uVar11 != (long)puVar8 - (long)puVar5) {
      std::operator<<(s,"::");
    }
    for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
      std::operator<<(s,(this->data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar12]);
    }
    cStack_1d0 = '\"';
    break;
  default:
    switch(cVar2) {
    case 'd':
      poVar6 = std::operator<<(s,'*');
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::operator<<(poVar6," {\n");
      for (iVar10 = 0; iVar10 <= indent; iVar10 = iVar10 + 1) {
        std::operator<<(s,'\t');
      }
      std::operator<<(s,"a: ");
      *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 8) = 0xf;
      uVar11 = 0;
      for (uVar4 = 0; uVar12 >> 3 != uVar4; uVar4 = uVar4 + 1) {
        if (uVar4 != 0) {
          std::operator<<(s,',');
        }
        if (uVar11 < 0x79) {
          uVar11 = uVar11 + 1;
        }
        else {
          std::operator<<(s,'\n');
          uVar11 = 0;
        }
        std::ostream::_M_insert<double>(pdVar3[uVar4]);
      }
      std::operator<<(s,'\n');
      iVar10 = 0;
      if (0 < indent) {
        iVar10 = indent;
      }
      while (iVar10 != 0) {
        std::operator<<(s,'\t');
        iVar10 = iVar10 + -1;
      }
      break;
    case 'f':
      poVar6 = std::operator<<(s,'*');
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::operator<<(poVar6," {\n");
      for (iVar10 = 0; iVar10 <= indent; iVar10 = iVar10 + 1) {
        std::operator<<(s,'\t');
      }
      std::operator<<(s,"a: ");
      uVar11 = 0;
      for (uVar4 = 0; uVar12 >> 2 != uVar4; uVar4 = uVar4 + 1) {
        if (uVar4 != 0) {
          std::operator<<(s,',');
        }
        if (uVar11 < 0x79) {
          uVar11 = uVar11 + 1;
        }
        else {
          std::operator<<(s,'\n');
          uVar11 = 0;
        }
        std::ostream::operator<<(s,*(float *)((long)pdVar3 + uVar4 * 4));
      }
      std::operator<<(s,'\n');
      iVar10 = 0;
      if (0 < indent) {
        iVar10 = indent;
      }
      while (iVar10 != 0) {
        std::operator<<(s,'\t');
        iVar10 = iVar10 + -1;
      }
      break;
    case 'i':
      poVar6 = std::operator<<(s,'*');
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::operator<<(poVar6," {\n");
      for (iVar10 = 0; iVar10 <= indent; iVar10 = iVar10 + 1) {
        std::operator<<(s,'\t');
      }
      std::operator<<(s,"a: ");
      uVar11 = 0;
      for (uVar4 = 0; uVar12 >> 2 != uVar4; uVar4 = uVar4 + 1) {
        if (uVar4 != 0) {
          std::operator<<(s,',');
        }
        if (uVar11 < 0x79) {
          uVar11 = uVar11 + 1;
        }
        else {
          std::operator<<(s,'\n');
          uVar11 = 0;
        }
        std::ostream::operator<<(s,(int)*(float *)((long)pdVar3 + uVar4 * 4));
      }
      std::operator<<(s,'\n');
      iVar10 = 0;
      if (0 < indent) {
        iVar10 = indent;
      }
      while (iVar10 != 0) {
        std::operator<<(s,'\t');
        iVar10 = iVar10 + -1;
      }
      break;
    case 'l':
      poVar6 = std::operator<<(s,'*');
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::operator<<(poVar6," {\n");
      for (iVar10 = 0; iVar10 <= indent; iVar10 = iVar10 + 1) {
        std::operator<<(s,'\t');
      }
      std::operator<<(s,"a: ");
      uVar11 = 0;
      for (uVar4 = 0; uVar12 >> 3 != uVar4; uVar4 = uVar4 + 1) {
        if (uVar4 != 0) {
          std::operator<<(s,',');
        }
        if (uVar11 < 0x79) {
          uVar11 = uVar11 + 1;
        }
        else {
          std::operator<<(s,'\n');
          uVar11 = 0;
        }
        std::ostream::_M_insert<long>((long)s);
      }
      std::operator<<(s,'\n');
      iVar10 = 0;
      if (0 < indent) {
        iVar10 = indent;
      }
      while (iVar10 != 0) {
        std::operator<<(s,'\t');
        iVar10 = iVar10 + -1;
      }
      break;
    default:
      if (cVar2 == 'Y') {
        std::ostream::operator<<(s,*(short *)pdVar3);
        return;
      }
    case 'e':
    case 'g':
    case 'h':
    case 'j':
    case 'k':
switchD_005a22a1_caseD_45:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
      std::operator<<((ostream *)&err,"Tried to dump property with invalid type \'");
      poVar6 = std::operator<<((ostream *)&err,this->type);
      std::operator<<(poVar6,"\'!");
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar7,asStack_1c8);
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::operator<<(s,"} ");
    return;
  }
  std::operator<<(s,cStack_1d0);
  return;
}

Assistant:

void FBXExportProperty::DumpAscii(std::ostream& s, int indent) {
    // no writing type... or anything. just shove it into the stream.
    uint8_t* d = data.data();
    size_t N;
    size_t swap = data.size();
    size_t count = 0;
    switch (type) {
    case 'C':
        if (*(reinterpret_cast<uint8_t*>(d))) { s << 'T'; }
        else { s << 'F'; }
        return;
    case 'Y': s << *(reinterpret_cast<int16_t*>(d)); return;
    case 'I': s << *(reinterpret_cast<int32_t*>(d)); return;
    case 'F': s << *(reinterpret_cast<float*>(d)); return;
    case 'D': s << *(reinterpret_cast<double*>(d)); return;
    case 'L': s << *(reinterpret_cast<int64_t*>(d)); return;
    case 'S':
        // first search to see if it has "\x00\x01" in it -
        // which separates fields which are reversed in the ascii version.
        // yeah.
        // FBX, yeah.
        for (size_t i = 0; i < data.size(); ++i) {
            if (data[i] == '\0') {
                swap = i;
                break;
            }
        }
    case 'R':
        s << '"';
        // we might as well check this now,
        // probably it will never happen
        for (size_t i = 0; i < data.size(); ++i) {
            char c = data[i];
            if (c == '"') {
                throw runtime_error("can't handle quotes in property string");
            }
        }
        // first write the SWAPPED member (if any)
        for (size_t i = swap + 2; i < data.size(); ++i) {
            char c = data[i];
            s << c;
        }
        // then a separator
        if (swap != data.size()) {
            s << "::";
        }
        // then the initial member
        for (size_t i = 0; i < swap; ++i) {
            char c = data[i];
            s << c;
        }
        s << '"';
        return;
    case 'i':
        N = data.size() / 4; // number of elements
        s << '*' << N << " {\n";
        for (int i = 0; i < indent + 1; ++i) { s << '\t'; }
        s << "a: ";
        for (size_t i = 0; i < N; ++i) {
            if (i > 0) { s << ','; }
            if (count++ > 120) { s << '\n'; count = 0; }
            s << (reinterpret_cast<int32_t*>(d))[i];
        }
        s << '\n';
        for (int i = 0; i < indent; ++i) { s << '\t'; }
        s << "} ";
        return;
    case 'l':
        N = data.size() / 8;
        s << '*' << N << " {\n";
        for (int i = 0; i < indent + 1; ++i) { s << '\t'; }
        s << "a: ";
        for (size_t i = 0; i < N; ++i) {
            if (i > 0) { s << ','; }
            if (count++ > 120) { s << '\n'; count = 0; }
            s << (reinterpret_cast<int64_t*>(d))[i];
        }
        s << '\n';
        for (int i = 0; i < indent; ++i) { s << '\t'; }
        s << "} ";
        return;
    case 'f':
        N = data.size() / 4;
        s << '*' << N << " {\n";
        for (int i = 0; i < indent + 1; ++i) { s << '\t'; }
        s << "a: ";
        for (size_t i = 0; i < N; ++i) {
            if (i > 0) { s << ','; }
            if (count++ > 120) { s << '\n'; count = 0; }
            s << (reinterpret_cast<float*>(d))[i];
        }
        s << '\n';
        for (int i = 0; i < indent; ++i) { s << '\t'; }
        s << "} ";
        return;
    case 'd':
        N = data.size() / 8;
        s << '*' << N << " {\n";
        for (int i = 0; i < indent + 1; ++i) { s << '\t'; }
        s << "a: ";
        // set precision to something that can handle doubles
        s.precision(15);
        for (size_t i = 0; i < N; ++i) {
            if (i > 0) { s << ','; }
            if (count++ > 120) { s << '\n'; count = 0; }
            s << (reinterpret_cast<double*>(d))[i];
        }
        s << '\n';
        for (int i = 0; i < indent; ++i) { s << '\t'; }
        s << "} ";
        return;
    default:
        std::ostringstream err;
        err << "Tried to dump property with invalid type '";
        err << type << "'!";
        throw runtime_error(err.str());
    }
}